

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

PatchList re2::PatchList::Append(Inst *inst0,PatchList l1,PatchList l2)

{
  PatchList PVar1;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  Inst *ip;
  PatchList next;
  PatchList l;
  Inst *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  uint32_t out;
  uint32_t uVar2;
  uint32_t local_4;
  
  local_4 = in_EDX;
  if ((in_ESI != 0) && (PVar1.p = in_ESI, local_4 = in_ESI, in_EDX != 0)) {
    do {
      out = PVar1.p;
      uVar2 = out;
      PVar1 = Deref(in_stack_ffffffffffffffc8,(uint32_t)in_stack_ffffffffffffffd0);
    } while (PVar1.p != 0);
    if ((uVar2 & 1) == 0) {
      Prog::Inst::set_out((Inst *)((ulong)uVar2 << 0x20),out);
    }
    else {
      *(uint32_t *)(in_RDI + (ulong)(uVar2 >> 1) * 8 + 4) = in_EDX;
    }
  }
  return (PatchList)local_4;
}

Assistant:

PatchList PatchList::Append(Prog::Inst* inst0, PatchList l1, PatchList l2) {
  if (l1.p == 0)
    return l2;
  if (l2.p == 0)
    return l1;

  PatchList l = l1;
  for (;;) {
    PatchList next = PatchList::Deref(inst0, l);
    if (next.p == 0)
      break;
    l = next;
  }

  Prog::Inst* ip = &inst0[l.p>>1];
  if (l.p&1)
    ip->out1_ = l2.p;
  else
    ip->set_out(l2.p);

  return l1;
}